

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignatureRefining.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_171::SignatureRefining::run::CodeUpdater::create(CodeUpdater *this)

{
  long in_RSI;
  undefined1 local_20 [16];
  CodeUpdater *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::SignatureRefining::run(wasm::Module*)::CodeUpdater,wasm::(anonymous_namespace)::SignatureRefining&,wasm::Module&>
            ((SignatureRefining *)local_20,*(Module **)(in_RSI + 0x130));
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::SignatureRefining::run(wasm::Module*)::CodeUpdater,std::default_delete<wasm::(anonymous_namespace)::SignatureRefining::run(wasm::Module*)::CodeUpdater>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<CodeUpdater,_std::default_delete<CodeUpdater>_> *)local_20);
  std::unique_ptr<CodeUpdater,_std::default_delete<CodeUpdater>_>::~unique_ptr
            ((unique_ptr<CodeUpdater,_std::default_delete<CodeUpdater>_> *)local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<CodeUpdater>(parent, wasm);
      }